

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Shortcut(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey in_EDI;
  ImGuiKey unaff_retaddr;
  ImGuiKey mods;
  ImGuiKey key;
  ImGuiContext *g;
  ImGuiID in_stack_fffffffffffffffc;
  
  pIVar1 = GImGui;
  bVar2 = SetShortcutRouting(unaff_retaddr,in_stack_fffffffffffffffc,in_EDI);
  if (bVar2) {
    if ((pIVar1->IO).KeyMods == (in_EDI & ImGuiMod_Mask_)) {
      if ((in_EDI & ~ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) {
        ConvertSingleModFlagToKey(in_EDI & ImGuiMod_Mask_);
      }
      bVar2 = IsKeyPressed(unaff_retaddr,in_stack_fffffffffffffffc,in_EDI);
      if (bVar2) {
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::Shortcut(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;

    // When using (owner_id == 0/Any): SetShortcutRouting() will use CurrentFocusScopeId and filter with this, so IsKeyPressed() is fine with he 0/Any.
    if ((flags & ImGuiInputFlags_RouteMask_) == 0)
        flags |= ImGuiInputFlags_RouteFocused;
    if (!SetShortcutRouting(key_chord, owner_id, flags))
        return false;

    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (g.IO.KeyMods != mods)
        return false;

    // Special storage location for mods
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);

    if (!IsKeyPressed(key, owner_id, (flags & (ImGuiInputFlags_Repeat | ImGuiInputFlags_RepeatRateMask_))))
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByShortcut) == 0); // Passing flags not supported by this function!

    return true;
}